

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.h
# Opt level: O2

failure_formatter_t * __thiscall bandit::detail::controller_t::get_formatter(controller_t *this)

{
  interface *ptr;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  ptr = (this->formatter)._M_t.
        super___uniq_ptr_impl<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_bandit::failure_formatter::interface_*,_std::default_delete<bandit::failure_formatter::interface>_>
        .super__Head_base<0UL,_bandit::failure_formatter::interface_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_30,"formatter",&local_51);
  std::__cxx11::string::string
            ((string *)&local_50,"bandit::detail::controller_t::set_formatter()",&local_52);
  throw_if_nullptr(ptr,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return (this->formatter)._M_t.
         super___uniq_ptr_impl<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
         ._M_t.
         super__Tuple_impl<0UL,_bandit::failure_formatter::interface_*,_std::default_delete<bandit::failure_formatter::interface>_>
         .super__Head_base<0UL,_bandit::failure_formatter::interface_*,_false>._M_head_impl;
}

Assistant:

failure_formatter_t& get_formatter() {
        throw_if_nullptr(formatter.get(), "formatter", "bandit::detail::controller_t::set_formatter()");
        return *formatter;
      }